

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

void __thiscall
pbrt::ImageInfiniteLight::ImageInfiniteLight
          (ImageInfiniteLight *this,Transform *renderFromLight,Image *im,
          RGBColorSpace *imageColorSpace,Float scale,string *filename,Allocator alloc)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  v_00;
  Allocator alloc_00;
  Allocator alloc_01;
  Bounds2f domain_00;
  Bounds2f domain_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  function<float_(pbrt::Point2<float>)> *dxdA;
  iterator __first;
  iterator __last;
  PiecewiseConstant2D *this_00;
  PiecewiseConstant2D *data;
  float *pfVar4;
  undefined8 in_RCX;
  long in_RDI;
  string *in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  double dVar5;
  Float *v;
  iterator __end1;
  iterator __begin1;
  Array2D<float> *__range1;
  Float average;
  Bounds2f domain;
  Array2D<float> d;
  size_t vb;
  int va;
  ImageChannelDesc channelDesc;
  PiecewiseConstant2D *in_stack_fffffffffffffb38;
  PiecewiseConstant2D *in_stack_fffffffffffffb40;
  WrapMode in_stack_fffffffffffffb48;
  LightType in_stack_fffffffffffffb4c;
  LightBase *in_stack_fffffffffffffb50;
  Image *in_stack_fffffffffffffb68;
  Allocator in_stack_fffffffffffffb70;
  PiecewiseConstant2D *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb80;
  undefined4 in_stack_fffffffffffffb84;
  char (*in_stack_fffffffffffffb88) [19];
  undefined4 in_stack_fffffffffffffb90;
  undefined4 uVar6;
  float in_stack_fffffffffffffb94;
  float fVar7;
  char *in_stack_fffffffffffffb98;
  undefined8 in_stack_fffffffffffffba0;
  LogLevel level;
  char *in_stack_fffffffffffffba8;
  undefined8 in_stack_fffffffffffffbb0;
  LogLevel level_00;
  char (*in_stack_fffffffffffffbc0) [2];
  undefined4 in_stack_fffffffffffffbc8;
  undefined4 in_stack_fffffffffffffbcc;
  char (*in_stack_fffffffffffffbd0) [19];
  unsigned_long *in_stack_fffffffffffffbd8;
  undefined7 in_stack_fffffffffffffbe0;
  Image *in_stack_fffffffffffffbf0;
  Allocator in_stack_fffffffffffffbf8;
  undefined7 in_stack_fffffffffffffc18;
  undefined1 in_stack_fffffffffffffc1f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffc20;
  size_t in_stack_fffffffffffffc28;
  string *psVar8;
  string *local_3d0;
  float local_2b0;
  float local_2ac;
  PiecewiseConstant2D *local_2a8;
  PiecewiseConstant2D *local_2a0;
  PiecewiseConstant2D *local_298;
  Array2D<float> *local_290;
  float local_284;
  undefined8 local_280;
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_1d0;
  undefined8 uStack_1c8;
  Array2D<float> local_170;
  Tuple2<pbrt::Point2,_int> local_150;
  Tuple2<pbrt::Point2,_int> local_148;
  Tuple2<pbrt::Point2,_int> local_140;
  Tuple2<pbrt::Point2,_int> local_138;
  function<float_(pbrt::Point2<float>)> *local_130;
  int local_128;
  undefined1 local_124;
  allocator<char> local_123;
  allocator<char> local_122;
  allocator<char> local_121;
  string *local_120;
  string local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_d8 [32];
  string *local_b8;
  undefined8 local_b0;
  undefined8 local_68;
  undefined8 local_60;
  undefined1 local_48 [16];
  string *local_38;
  undefined4 local_2c;
  undefined8 local_28;
  undefined8 local_8;
  
  local_48 = (undefined1  [16])0x0;
  local_38 = in_R8;
  local_2c = in_XMM0_Da;
  local_28 = in_RCX;
  local_8 = in_R9;
  MediumInterface::MediumInterface((MediumInterface *)in_stack_fffffffffffffb40);
  LightBase::LightBase
            (in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
             (Transform *)in_stack_fffffffffffffb40,(MediumInterface *)in_stack_fffffffffffffb38);
  std::__cxx11::string::string((string *)(in_RDI + 0x98),local_38);
  Image::Image((Image *)in_stack_fffffffffffffb70.memoryResource,in_stack_fffffffffffffb68);
  *(undefined8 *)(in_RDI + 0x1d0) = local_28;
  *(undefined4 *)(in_RDI + 0x1d8) = local_2c;
  WrapMode2D::WrapMode2D
            ((WrapMode2D *)in_stack_fffffffffffffb50,in_stack_fffffffffffffb4c,
             in_stack_fffffffffffffb48);
  Point3<float>::Point3((Point3<float> *)0x6f3bc7);
  local_60 = local_8;
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
  local_68 = local_8;
  PiecewiseConstant2D::PiecewiseConstant2D
            ((PiecewiseConstant2D *)in_stack_fffffffffffffb68,in_stack_fffffffffffffb70);
  local_124 = 1;
  local_120 = local_118;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78,
             (allocator<char> *)in_stack_fffffffffffffb70.memoryResource);
  local_120 = (string *)local_f8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78,
             (allocator<char> *)in_stack_fffffffffffffb70.memoryResource);
  local_120 = (string *)local_d8;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
             (char *)in_stack_fffffffffffffb78,
             (allocator<char> *)in_stack_fffffffffffffb70.memoryResource);
  local_124 = 0;
  local_b8 = local_118;
  local_b0 = 3;
  v_00._M_array._4_4_ = in_stack_fffffffffffffb4c;
  v_00._M_array._0_4_ = in_stack_fffffffffffffb48;
  v_00._M_len = (size_type)in_stack_fffffffffffffb50;
  pstd::span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::span((span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)in_stack_fffffffffffffb40,v_00);
  requestedChannels.n = in_stack_fffffffffffffc28;
  requestedChannels.ptr = in_stack_fffffffffffffc20;
  Image::GetChannelDesc
            ((Image *)CONCAT17(in_stack_fffffffffffffc1f,in_stack_fffffffffffffc18),
             requestedChannels);
  psVar8 = local_118;
  local_3d0 = (string *)&local_b8;
  do {
    local_3d0 = local_3d0 + -0x20;
    std::__cxx11::string::~string(local_3d0);
    level = (LogLevel)((ulong)in_stack_fffffffffffffba0 >> 0x20);
    level_00 = (LogLevel)((ulong)in_stack_fffffffffffffbb0 >> 0x20);
  } while (local_3d0 != psVar8);
  std::allocator<char>::~allocator(&local_123);
  std::allocator<char>::~allocator(&local_122);
  std::allocator<char>::~allocator(&local_121);
  bVar1 = ImageChannelDesc::operator_cast_to_bool((ImageChannelDesc *)0x6f3e22);
  if (!bVar1) {
    ErrorExit<std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffb70.memoryResource,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb68);
  }
  local_128 = 3;
  dxdA = (function<float_(pbrt::Point2<float>)> *)
         ImageChannelDesc::size((ImageChannelDesc *)0x6f400d);
  local_130 = dxdA;
  if ((function<float_(pbrt::Point2<float>)> *)(long)local_128 != dxdA) {
    LogFatal<char_const(&)[2],char_const(&)[19],char_const(&)[2],int&,char_const(&)[19],unsigned_long&>
              (level_00,in_stack_fffffffffffffba8,level,in_stack_fffffffffffffb98,
               (char (*) [2])CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb88,in_stack_fffffffffffffbc0,
               (int *)CONCAT44(in_stack_fffffffffffffbcc,in_stack_fffffffffffffbc8),
               in_stack_fffffffffffffbd0,in_stack_fffffffffffffbd8);
  }
  uVar2 = ImageChannelDesc::IsIdentity
                    ((ImageChannelDesc *)
                     CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  if (!(bool)uVar2) {
    LogFatal<char_const(&)[25]>
              (level,in_stack_fffffffffffffb98,(int)in_stack_fffffffffffffb94,
               *in_stack_fffffffffffffb88,
               (char (*) [25])CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80));
  }
  local_138 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
  iVar3 = local_138.x;
  local_140 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
  if (iVar3 != local_140.y) {
    local_148 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
    local_150 = (Tuple2<pbrt::Point2,_int>)Image::Resolution((Image *)(in_RDI + 0xb8));
    ErrorExit<std::__cxx11::string_const&,int,int>
              ((char *)CONCAT44(in_stack_fffffffffffffb84,in_stack_fffffffffffffb80),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb78,(int *)in_stack_fffffffffffffb70.memoryResource,
               (int *)in_stack_fffffffffffffb68);
  }
  std::function<float(pbrt::Point2<float>)>::
  function<pbrt::Image::GetSamplingDistribution(std::function<float(pbrt::Point2<float>)>,pbrt::Bounds2<float>const&,pstd::pmr::polymorphic_allocator<std::byte>)::_default_arg_3_::_lambda(pbrt::Point2<float>)_1_,void>
            ((function<float_(pbrt::Point2<float>)> *)in_stack_fffffffffffffb50,
             (anon_class_1_0_00000001 *)
             CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),SUB84(in_stack_fffffffffffffb38,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),SUB84(in_stack_fffffffffffffb38,0));
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffffb50,
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Point2<float> *)in_stack_fffffffffffffb40);
  pstd::pmr::polymorphic_allocator<std::byte>::polymorphic_allocator
            ((polymorphic_allocator<std::byte> *)in_stack_fffffffffffffb40);
  Image::GetSamplingDistribution
            (in_stack_fffffffffffffbf0,dxdA,(Bounds2f *)CONCAT17(uVar2,in_stack_fffffffffffffbe0),
             in_stack_fffffffffffffbf8);
  std::function<float_(pbrt::Point2<float>)>::~function
            ((function<float_(pbrt::Point2<float>)> *)0x6f42a8);
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),SUB84(in_stack_fffffffffffffb38,0));
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffb40,
             (float)((ulong)in_stack_fffffffffffffb38 >> 0x20),SUB84(in_stack_fffffffffffffb38,0));
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)in_stack_fffffffffffffb50,
             (Point2<float> *)CONCAT44(in_stack_fffffffffffffb4c,in_stack_fffffffffffffb48),
             (Point2<float> *)in_stack_fffffffffffffb40);
  local_278 = local_1d0;
  uStack_270 = uStack_1c8;
  local_280 = local_8;
  domain_00.pMax.super_Tuple2<pbrt::Point2,_float>.x = (float)in_stack_fffffffffffffb90;
  domain_00.pMin.super_Tuple2<pbrt::Point2,_float> =
       (Tuple2<pbrt::Point2,_float>)in_stack_fffffffffffffb88;
  domain_00.pMax.super_Tuple2<pbrt::Point2,_float>.y = in_stack_fffffffffffffb94;
  alloc_00.memoryResource._4_4_ = in_stack_fffffffffffffb84;
  alloc_00.memoryResource._0_4_ = in_stack_fffffffffffffb80;
  PiecewiseConstant2D::PiecewiseConstant2D
            (in_stack_fffffffffffffb78,(Array2D<float> *)in_stack_fffffffffffffb70.memoryResource,
             domain_00,alloc_00);
  PiecewiseConstant2D::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  PiecewiseConstant2D::~PiecewiseConstant2D(in_stack_fffffffffffffb40);
  __first = Array2D<float>::begin(&local_170);
  __last = Array2D<float>::end((Array2D<float> *)in_stack_fffffffffffffb40);
  uVar6 = SUB84(__last,0);
  fVar7 = (float)((ulong)__last >> 0x20);
  dVar5 = std::accumulate<float*,double>(__first,__last,0.0);
  iVar3 = Array2D<float>::size((Array2D<float> *)0x6f43c7);
  local_284 = (float)(dVar5 / (double)iVar3);
  local_290 = &local_170;
  this_00 = (PiecewiseConstant2D *)Array2D<float>::begin(local_290);
  local_298 = this_00;
  data = (PiecewiseConstant2D *)Array2D<float>::end((Array2D<float> *)in_stack_fffffffffffffb40);
  local_2a0 = data;
  for (; local_298 != local_2a0;
      local_298 = (PiecewiseConstant2D *)
                  &(local_298->domain).pMin.super_Tuple2<pbrt::Point2,_float>.y) {
    local_2a8 = local_298;
    local_2ac = (local_298->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x - local_284;
    local_2b0 = local_284 * 0.001;
    pfVar4 = std::min<float>(&local_2b0,(float *)local_298);
    pfVar4 = std::max<float>(&local_2ac,pfVar4);
    (local_2a8->domain).pMin.super_Tuple2<pbrt::Point2,_float>.x = *pfVar4;
  }
  domain_01.pMax.super_Tuple2<pbrt::Point2,_float>.x = (float)uVar6;
  domain_01.pMin.super_Tuple2<pbrt::Point2,_float> = (Tuple2<pbrt::Point2,_float>)dVar5;
  domain_01.pMax.super_Tuple2<pbrt::Point2,_float>.y = fVar7;
  alloc_01.memoryResource._4_4_ = iVar3;
  alloc_01.memoryResource._0_4_ = in_stack_fffffffffffffb80;
  PiecewiseConstant2D::PiecewiseConstant2D(this_00,(Array2D<float> *)data,domain_01,alloc_01);
  PiecewiseConstant2D::operator=(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38);
  PiecewiseConstant2D::~PiecewiseConstant2D(in_stack_fffffffffffffb40);
  Array2D<float>::~Array2D((Array2D<float> *)in_stack_fffffffffffffb50);
  ImageChannelDesc::~ImageChannelDesc((ImageChannelDesc *)0x6f4604);
  return;
}

Assistant:

ImageInfiniteLight::ImageInfiniteLight(const Transform &renderFromLight, Image im,
                                       const RGBColorSpace *imageColorSpace, Float scale,
                                       const std::string &filename, Allocator alloc)
    : LightBase(LightType::Infinite, renderFromLight, MediumInterface()),
      image(std::move(im)),
      imageColorSpace(imageColorSpace),
      scale(scale),
      filename(filename),
      wrapMode(WrapMode::OctahedralSphere, WrapMode::OctahedralSphere),
      distribution(alloc),
      compensatedDistribution(alloc) {
    // Initialize sampling PDFs for image infinite area light
    ImageChannelDesc channelDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!channelDesc)
        ErrorExit("%s: image used for ImageInfiniteLight doesn't have R, G, B "
                  "channels.",
                  filename);
    CHECK_EQ(3, channelDesc.size());
    CHECK(channelDesc.IsIdentity());
    if (image.Resolution().x != image.Resolution().y)
        ErrorExit("%s: image resolution (%d, %d) is non-square. It's unlikely "
                  "this is an equirect environment map.",
                  filename, image.Resolution().x, image.Resolution().y);
    Array2D<Float> d = image.GetSamplingDistribution();
    Bounds2f domain = Bounds2f(Point2f(0, 0), Point2f(1, 1));
    distribution = PiecewiseConstant2D(d, domain, alloc);

    // Initialize compensated PDF for image infinite area light
    Float average = std::accumulate(d.begin(), d.end(), 0.) / d.size();
    for (Float &v : d)
        v = std::max<Float>(v - average, std::min<Float>(.001f * average, v));
    compensatedDistribution = PiecewiseConstant2D(d, domain, alloc);
}